

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

QFont * QApplication::font(QWidget *widget)

{
  bool bVar1;
  const_iterator *this;
  qsizetype qVar2;
  char *pcVar3;
  QFont *pQVar4;
  undefined8 *in_RSI;
  QFont *in_RDI;
  long in_FS_OFFSET;
  QMetaObject *metaObj;
  FontHash *hash;
  FontHashConstIt cend;
  FontHashConstIt it;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_>
  *in_stack_ffffffffffffff48;
  const_iterator *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  QMetaObject *local_88;
  QByteArray local_68;
  piter local_50;
  piter local_40;
  QByteArray local_30;
  piter local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = (const_iterator *)
         QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_>::operator()
                   (in_stack_ffffffffffffff48);
  if (((in_RSI != (undefined8 *)0x0) && (this != (const_iterator *)0x0)) &&
     (qVar2 = QHash<QByteArray,_QFont>::size((QHash<QByteArray,_QFont> *)this), qVar2 != 0)) {
    local_88 = (QMetaObject *)(**(code **)*in_RSI)();
    local_18.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_18.d = (Data<QHashPrivate::Node<QByteArray,_QFont>_> *)&DAT_aaaaaaaaaaaaaaaa;
    pcVar3 = (char *)QMetaObject::className();
    QByteArray::QByteArray(&local_30,pcVar3,-1);
    local_18 = (piter)QHash<QByteArray,_QFont>::constFind
                                ((QHash<QByteArray,_QFont> *)in_stack_ffffffffffffff50,
                                 (QByteArray *)in_stack_ffffffffffffff48);
    QByteArray::~QByteArray((QByteArray *)0x2cbc37);
    local_40.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_40.d = (Data<QHashPrivate::Node<QByteArray,_QFont>_> *)&DAT_aaaaaaaaaaaaaaaa;
    local_40 = (piter)QHash<QByteArray,_QFont>::constEnd
                                ((QHash<QByteArray,_QFont> *)
                                 CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    while( true ) {
      bVar1 = QHash<QByteArray,_QFont>::const_iterator::operator==
                        ((const_iterator *)
                         CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                         in_stack_ffffffffffffff50);
      in_stack_ffffffffffffff5f = bVar1 && local_88 != &QWidget::staticMetaObject;
      if (!bVar1 || local_88 == &QWidget::staticMetaObject) break;
      local_88 = QMetaObject::superClass((QMetaObject *)0x2cbcb1);
      in_stack_ffffffffffffff50 = this;
      pcVar3 = (char *)QMetaObject::className();
      QByteArray::QByteArray(&local_68,pcVar3,-1);
      local_50 = (piter)QHash<QByteArray,_QFont>::constFind
                                  ((QHash<QByteArray,_QFont> *)in_stack_ffffffffffffff50,
                                   (QByteArray *)in_stack_ffffffffffffff48);
      local_18 = local_50;
      QByteArray::~QByteArray((QByteArray *)0x2cbd1b);
    }
    bVar1 = QHash<QByteArray,_QFont>::const_iterator::operator!=
                      ((const_iterator *)
                       CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                       in_stack_ffffffffffffff50);
    if (bVar1) {
      pQVar4 = QHash<QByteArray,_QFont>::const_iterator::value((const_iterator *)0x2cbd45);
      QFont::QFont(in_RDI,pQVar4);
      goto LAB_002cbd60;
    }
  }
  font();
LAB_002cbd60:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QFont QApplication::font(const QWidget *widget)
{
    typedef FontHash::const_iterator FontHashConstIt;

    FontHash *hash = app_fonts();

    if (widget && hash  && hash->size()) {
#ifdef Q_OS_MAC
        // short circuit for small and mini controls
        if (widget->testAttribute(Qt::WA_MacSmallSize)) {
            return hash->value(QByteArrayLiteral("QSmallFont"));
        } else if (widget->testAttribute(Qt::WA_MacMiniSize)) {
            return hash->value(QByteArrayLiteral("QMiniFont"));
        }
#endif
        // Return the font for the nearest registered superclass
        const QMetaObject *metaObj = widget->metaObject();
        FontHashConstIt it = hash->constFind(metaObj->className());
        const FontHashConstIt cend = hash->constEnd();
        while (it == cend && metaObj != &QWidget::staticMetaObject) {
            metaObj = metaObj->superClass();
            it = hash->constFind(metaObj->className());
        }
        if (it != cend)
            return it.value();
    }
    return font();
}